

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmpx.c
# Opt level: O0

void iauPmpx(double rc,double dc,double pr,double pd,double px,double rv,double pmt,double *pob,
            double *pco)

{
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  double *in_XMM6_Qa;
  double pm [3];
  double pdz;
  double w;
  double pxr;
  double dt;
  double p [3];
  double z;
  double y;
  double x;
  double cd;
  double sd;
  double cr;
  double sr;
  int i;
  double AULTY;
  double VF;
  double local_b8 [4];
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  int local_5c;
  undefined8 local_58;
  undefined8 local_50;
  double *local_40;
  double *local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  double local_8;
  
  local_50 = 0x3fcb0064e2dc9ced;
  local_58 = 0x3ef094a33c2ea95a;
  local_40 = in_RDI;
  local_38 = in_XMM6_Qa;
  local_30 = in_XMM5_Qa;
  local_28 = in_XMM4_Qa;
  local_20 = in_XMM3_Qa;
  local_18 = in_XMM2_Qa;
  local_10 = in_XMM1_Qa;
  local_8 = in_XMM0_Qa;
  local_68 = sin(in_XMM0_Qa);
  local_70 = cos(local_8);
  local_78 = sin(local_10);
  local_80 = cos(local_10);
  local_b8[0] = local_70 * local_80;
  local_b8[1] = local_68 * local_80;
  local_98 = local_78;
  local_b8[2] = local_78;
  local_90 = local_b8[1];
  local_88 = local_b8[0];
  dVar1 = iauPdp(local_b8,local_40);
  dVar2 = local_30 * 0.2109495265696987 * local_28 * 4.84813681109536e-06;
  for (local_5c = 0; local_5c < 3; local_5c = local_5c + 1) {
    local_b8[local_5c] =
         (dVar1 * 1.581250740982066e-05 + (double)local_38) *
         *(double *)(&stack0xffffffffffffff08 + (long)local_5c * 8) +
         -(local_28 * 4.84813681109536e-06 * local_40[local_5c]) + local_b8[local_5c];
  }
  iauPn((double *)(dVar2 * local_90 + local_18 * local_88 + -(local_20 * local_98 * local_68)),
        (double *)(dVar2 * local_88 + -local_18 * local_90 + -(local_20 * local_98 * local_70)),
        local_38);
  return;
}

Assistant:

void iauPmpx(double rc, double dc, double pr, double pd,
             double px, double rv, double pmt, double pob[3],
             double pco[3])
/*
**  - - - - - - - -
**   i a u P m p x
**  - - - - - - - -
**
**  Proper motion and parallax.
**
**  This function is part of the International Astronomical Union's
**  SOFA (Standards of Fundamental Astronomy) software collection.
**
**  Status:  support function.
**
**  Given:
**     rc,dc  double     ICRS RA,Dec at catalog epoch (radians)
**     pr     double     RA proper motion (radians/year, Note 1)
**     pd     double     Dec proper motion (radians/year)
**     px     double     parallax (arcsec)
**     rv     double     radial velocity (km/s, +ve if receding)
**     pmt    double     proper motion time interval (SSB, Julian years)
**     pob    double[3]  SSB to observer vector (au)
**
**  Returned:
**     pco    double[3]  coordinate direction (BCRS unit vector)
**
**  Notes:
**
**  1) The proper motion in RA is dRA/dt rather than cos(Dec)*dRA/dt.
**
**  2) The proper motion time interval is for when the starlight
**     reaches the solar system barycenter.
**
**  3) To avoid the need for iteration, the Roemer effect (i.e. the
**     small annual modulation of the proper motion coming from the
**     changing light time) is applied approximately, using the
**     direction of the star at the catalog epoch.
**
**  References:
**
**     1984 Astronomical Almanac, pp B39-B41.
**
**     Urban, S. & Seidelmann, P. K. (eds), Explanatory Supplement to
**     the Astronomical Almanac, 3rd ed., University Science Books
**     (2013), Section 7.2.
**
**  Called:
**     iauPdp       scalar product of two p-vectors
**     iauPn        decompose p-vector into modulus and direction
**
**  This revision:   2021 April 3
**
**  SOFA release 2021-05-12
**
**  Copyright (C) 2021 IAU SOFA Board.  See notes at end.
*/
{
/* Km/s to au/year */
   const double VF = DAYSEC*DJM/DAU;

/* Light time for 1 au, Julian years */
   const double AULTY = AULT/DAYSEC/DJY;

   int i;
   double sr, cr, sd, cd, x, y, z, p[3], dt, pxr, w, pdz, pm[3];


/* Spherical coordinates to unit vector (and useful functions). */
   sr = sin(rc);
   cr = cos(rc);
   sd = sin(dc);
   cd = cos(dc);
   p[0] = x = cr*cd;
   p[1] = y = sr*cd;
   p[2] = z = sd;

/* Proper motion time interval (y) including Roemer effect. */
   dt = pmt + iauPdp(p,pob)*AULTY;

/* Space motion (radians per year). */
   pxr = px * DAS2R;
   w = VF * rv * pxr;
   pdz = pd * z;
   pm[0] = - pr*y - pdz*cr + w*x;
   pm[1] =   pr*x - pdz*sr + w*y;
   pm[2] =   pd*cd + w*z;

/* Coordinate direction of star (unit vector, BCRS). */
   for (i = 0; i < 3; i++) {
      p[i] += dt*pm[i] - pxr*pob[i];
   }
   iauPn(p, &w, pco);

/* Finished. */

/*----------------------------------------------------------------------
**
**  Copyright (C) 2021
**  Standards Of Fundamental Astronomy Board
**  of the International Astronomical Union.
**
**  =====================
**  SOFA Software License
**  =====================
**
**  NOTICE TO USER:
**
**  BY USING THIS SOFTWARE YOU ACCEPT THE FOLLOWING SIX TERMS AND
**  CONDITIONS WHICH APPLY TO ITS USE.
**
**  1. The Software is owned by the IAU SOFA Board ("SOFA").
**
**  2. Permission is granted to anyone to use the SOFA software for any
**     purpose, including commercial applications, free of charge and
**     without payment of royalties, subject to the conditions and
**     restrictions listed below.
**
**  3. You (the user) may copy and distribute SOFA source code to others,
**     and use and adapt its code and algorithms in your own software,
**     on a world-wide, royalty-free basis.  That portion of your
**     distribution that does not consist of intact and unchanged copies
**     of SOFA source code files is a "derived work" that must comply
**     with the following requirements:
**
**     a) Your work shall be marked or carry a statement that it
**        (i) uses routines and computations derived by you from
**        software provided by SOFA under license to you; and
**        (ii) does not itself constitute software provided by and/or
**        endorsed by SOFA.
**
**     b) The source code of your derived work must contain descriptions
**        of how the derived work is based upon, contains and/or differs
**        from the original SOFA software.
**
**     c) The names of all routines in your derived work shall not
**        include the prefix "iau" or "sofa" or trivial modifications
**        thereof such as changes of case.
**
**     d) The origin of the SOFA components of your derived work must
**        not be misrepresented;  you must not claim that you wrote the
**        original software, nor file a patent application for SOFA
**        software or algorithms embedded in the SOFA software.
**
**     e) These requirements must be reproduced intact in any source
**        distribution and shall apply to anyone to whom you have
**        granted a further right to modify the source code of your
**        derived work.
**
**     Note that, as originally distributed, the SOFA software is
**     intended to be a definitive implementation of the IAU standards,
**     and consequently third-party modifications are discouraged.  All
**     variations, no matter how minor, must be explicitly marked as
**     such, as explained above.
**
**  4. You shall not cause the SOFA software to be brought into
**     disrepute, either by misuse, or use for inappropriate tasks, or
**     by inappropriate modification.
**
**  5. The SOFA software is provided "as is" and SOFA makes no warranty
**     as to its use or performance.   SOFA does not and cannot warrant
**     the performance or results which the user may obtain by using the
**     SOFA software.  SOFA makes no warranties, express or implied, as
**     to non-infringement of third party rights, merchantability, or
**     fitness for any particular purpose.  In no event will SOFA be
**     liable to the user for any consequential, incidental, or special
**     damages, including any lost profits or lost savings, even if a
**     SOFA representative has been advised of such damages, or for any
**     claim by any third party.
**
**  6. The provision of any version of the SOFA software under the terms
**     and conditions specified herein does not imply that future
**     versions will also be made available under the same terms and
**     conditions.
*
**  In any published work or commercial product which uses the SOFA
**  software directly, acknowledgement (see www.iausofa.org) is
**  appreciated.
**
**  Correspondence concerning SOFA software should be addressed as
**  follows:
**
**      By email:  sofa@ukho.gov.uk
**      By post:   IAU SOFA Center
**                 HM Nautical Almanac Office
**                 UK Hydrographic Office
**                 Admiralty Way, Taunton
**                 Somerset, TA1 2DN
**                 United Kingdom
**
**--------------------------------------------------------------------*/
}